

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
          (CompilerGLSL *this,char **t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,uint *ts_3,
          char (*ts_4) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          char (*ts_6) [3])

{
  StringStream<4096UL,_4096UL> *this_00;
  char *__s;
  size_t sVar1;
  
  this_00 = &this->buffer;
  __s = *t;
  sVar1 = strlen(__s);
  StringStream<4096UL,_4096UL>::append(this_00,__s,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts->_M_dataplus)._M_p,ts->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_1);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_1,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_2->_M_dataplus)._M_p,ts_2->_M_string_length);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::operator<<(this_00,*ts_3);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_4);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_4,sVar1);
  this->statement_count = this->statement_count + 1;
  StringStream<4096UL,_4096UL>::append(this_00,(ts_5->_M_dataplus)._M_p,ts_5->_M_string_length);
  this->statement_count = this->statement_count + 1;
  sVar1 = strlen(*ts_6);
  StringStream<4096UL,_4096UL>::append(this_00,*ts_6,sVar1);
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}